

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcsFile.cpp
# Opt level: O3

void mcsFile::WriteSectorHeader(ofstream *file,uint num)

{
  ofstream *poVar1;
  long lVar2;
  ostream *poVar3;
  
  lVar2 = *(long *)file;
  *(uint *)(file + *(long *)(lVar2 + -0x18) + 0x18) =
       *(uint *)(file + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar1 = file + *(long *)(lVar2 + -0x18);
  if (file[*(long *)(lVar2 + -0x18) + 0xe1] == (ofstream)0x0) {
    std::ios::widen((char)poVar1);
    poVar1[0xe1] = (ofstream)0x1;
    lVar2 = *(long *)file;
  }
  poVar1[0xe0] = (ofstream)0x30;
  *(uint *)(file + *(long *)(lVar2 + -0x18) + 0x18) =
       *(uint *)(file + *(long *)(lVar2 + -0x18) + 0x18) | 0x4000;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,":",1);
  *(uint *)(file + *(long *)(*(long *)file + -0x18) + 0x18) =
       *(uint *)(file + *(long *)(*(long *)file + -0x18) + 0x18) & 0xffffffb5 | 8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"02000004",8);
  *(undefined8 *)(file + *(long *)(*(long *)file + -0x18) + 0x10) = 4;
  std::ostream::_M_insert<unsigned_long>((ulong)file);
  *(undefined8 *)(file + *(long *)(*(long *)file + -0x18) + 0x10) = 2;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)file);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void mcsFile::WriteSectorHeader(std::ofstream &file, unsigned int num)
{
    file << std::hex << std::setfill('0') << std::uppercase;
    file << ":" << std::hex << "02000004";
    unsigned long csum_computed = 0x02 + 0x04;
    file << std::setw(4) << static_cast<unsigned short>(num);
    csum_computed += num&0x000000ff;
    csum_computed += (num&0x0000ff00)>>8;
    csum_computed = (~csum_computed+1)&0x000000ff;
    file << std::setw(2) << csum_computed << std::endl;
}